

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed
          (vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *__return_storage_ptr__,
          LegacyScriptPubKeyMan *this,int64_t keypool_id)

{
  _Rb_tree_header *p_Var1;
  map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_> *this_00;
  long lVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  iterator __position_00;
  _Base_ptr p_Var6;
  long lVar7;
  _Base_ptr p_Var8;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *this_01;
  CKeyPool *pCVar9;
  iterator iVar10;
  long in_FS_OFFSET;
  byte bVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_long>_>,_std::_Rb_tree_iterator<std::pair<const_CKeyID,_long>_>_>
  pVar12;
  WalletBatch batch;
  CKeyPool keypool;
  WalletBatch local_b0;
  CKeyID local_9c;
  CKeyPool local_88;
  long local_38;
  WalletDatabase *pWVar5;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(long *)(p_Var8 + 1) < keypool_id])
  {
    if (keypool_id <= *(long *)(p_Var8 + 1)) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var8 = p_Var6, keypool_id < *(long *)(p_Var6 + 1))
     ) {
    p_Var8 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    p_Var1 = &(this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(long *)(p_Var8 + 1) < keypool_id]
        ) {
      if (keypool_id <= *(long *)(p_Var8 + 1)) {
        p_Var6 = p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var8 = p_Var6, keypool_id < *(long *)(p_Var6 + 1))) {
      p_Var8 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      p_Var1 = &(this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.
                super__Rb_tree_header;
      p_Var8 = (this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header
               ._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; p_Var8 != (_Base_ptr)0x0;
          p_Var8 = (&p_Var8->_M_left)[*(long *)(p_Var8 + 1) < keypool_id]) {
        if (keypool_id <= *(long *)(p_Var8 + 1)) {
          p_Var6 = p_Var8;
        }
      }
      p_Var8 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var8 = p_Var6, keypool_id < *(long *)(p_Var6 + 1))) {
        p_Var8 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
        __assert_fail("setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x5ec,
                      "std::vector<CKeyPool> wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t)"
                     );
      }
    }
    this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
              &(this->super_LegacyDataSPKM).set_pre_split_keypool;
    if ((this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
        _M_node_count == 0) {
      this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                &(this->super_LegacyDataSPKM).setExternalKeyPool;
    }
  }
  else {
    this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
              &(this->super_LegacyDataSPKM).setInternalKeyPool;
  }
  __position_00._M_node = *(_Base_ptr *)(this_01 + 0x18);
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar4);
  (*pWVar5->_vptr_WalletDatabase[0xe])(&local_b0,pWVar5,1);
  this_00 = &(this->super_LegacyDataSPKM).m_pool_key_to_index;
  local_b0.m_database = pWVar5;
  do {
    if (__position_00._M_node == (_Base_ptr)(this_01 + 8)) break;
    lVar2 = *(long *)(__position_00._M_node + 1);
    if (lVar2 <= keypool_id) {
      CKeyPool::CKeyPool(&local_88);
      bVar3 = WalletBatch::ReadPool(&local_b0,*(int64_t *)(__position_00._M_node + 1),&local_88);
      if (bVar3) {
        CPubKey::GetID(&local_9c,&local_88.vchPubKey);
        pVar12 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                 ::equal_range(&this_00->_M_t,&local_9c);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar12.first._M_node,
                       (_Base_ptr)pVar12.second._M_node);
      }
      LearnRelatedScripts(this,&local_88.vchPubKey,P2SH_SEGWIT);
      WalletBatch::ErasePool(&local_b0,*(int64_t *)(__position_00._M_node + 1));
      ScriptPubKeyMan::WalletLogPrintf<long>
                ((ScriptPubKeyMan *)this,"keypool index %d removed\n",
                 *(long *)(__position_00._M_node + 1));
      __position_00 =
           std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
           erase_abi_cxx11_(this_01,__position_00._M_node);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::
        _M_realloc_insert<wallet::CKeyPool>(__return_storage_ptr__,__position,&local_88);
      }
      else {
        pCVar9 = &local_88;
        iVar10._M_current = __position._M_current;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          (iVar10._M_current)->nTime = pCVar9->nTime;
          pCVar9 = (CKeyPool *)((long)pCVar9 + (ulong)bVar11 * -0x10 + 8);
          iVar10._M_current = iVar10._M_current + (ulong)bVar11 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  } while (lVar2 <= keypool_id);
  if (local_b0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_b0.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CKeyPool> LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t keypool_id)
{
    AssertLockHeld(cs_KeyStore);
    bool internal = setInternalKeyPool.count(keypool_id);
    if (!internal) assert(setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id));
    std::set<int64_t> *setKeyPool = internal ? &setInternalKeyPool : (set_pre_split_keypool.empty() ? &setExternalKeyPool : &set_pre_split_keypool);
    auto it = setKeyPool->begin();

    std::vector<CKeyPool> result;
    WalletBatch batch(m_storage.GetDatabase());
    while (it != std::end(*setKeyPool)) {
        const int64_t& index = *(it);
        if (index > keypool_id) break; // set*KeyPool is ordered

        CKeyPool keypool;
        if (batch.ReadPool(index, keypool)) { //TODO: This should be unnecessary
            m_pool_key_to_index.erase(keypool.vchPubKey.GetID());
        }
        LearnAllRelatedScripts(keypool.vchPubKey);
        batch.ErasePool(index);
        WalletLogPrintf("keypool index %d removed\n", index);
        it = setKeyPool->erase(it);
        result.push_back(std::move(keypool));
    }

    return result;
}